

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index aohI,Index t,Index *aIs,Index *oIs)

{
  pointer pvVar1;
  long lVar2;
  undefined1 auVar3 [16];
  Index IVar4;
  int iVar5;
  size_t nrO;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Index aoI;
  uint uVar9;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var_00 [56];
  undefined1 auVar12 [64];
  undefined1 in_XMM2 [16];
  size_t nrA;
  undefined1 auVar11 [64];
  undefined1 auVar10 [16];
  undefined1 extraout_var_01 [56];
  
  uVar6 = (ulong)agentI;
  pvVar1 = (this->_m_firstAOHIforT).
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->_m_firstAOHIforT).
                 super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar8 = uVar6;
  if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
    uVar8 = (ulong)t;
    lVar2 = *(long *)&pvVar1[uVar6].
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data;
    if (uVar8 < (ulong)((long)pvVar1[uVar6].
                              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 3)) {
      IVar4 = Globals::CastLIndexToIndex(*(LIndex *)(lVar2 + uVar8 * 8));
      nrO = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,agentI);
      auVar11._8_56_ = extraout_var_00;
      auVar11._0_8_ = extraout_XMM0_Qa;
      auVar10 = auVar11._0_16_;
      iVar5 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,(ulong)agentI);
      nrA = CONCAT44(extraout_var,iVar5);
      if (t != 0) {
        uVar9 = aohI - IVar4;
        auVar10 = vcvtusi2sd_avx512f(auVar10,nrA * nrO);
        iVar5 = t - 1;
        uVar7 = 0;
        do {
          auVar3 = vcvtusi2sd_avx512f(in_XMM2,iVar5);
          auVar12._0_8_ = pow(auVar10._0_8_,auVar3._0_8_);
          auVar12._8_56_ = extraout_var_01;
          uVar6 = vcvttsd2usi_avx512f(auVar12._0_16_);
          aoI = (Index)(uVar9 / uVar6);
          uVar9 = uVar9 - (int)uVar6 * aoI;
          IVar4 = IndexTools::ActionObservation_to_ActionIndex(aoI,nrA,nrO);
          aIs[uVar7] = IVar4;
          IVar4 = IndexTools::ActionObservation_to_ObservationIndex(aoI,nrA,nrO);
          oIs[uVar7] = IVar4;
          uVar7 = uVar7 + 1;
          iVar5 = iVar5 + -1;
        } while (uVar8 != uVar7);
      }
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8);
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
    (Index agentI, Index aohI, Index t,  Index aIs[], Index oIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index aohIwithinThisT = aohI - CastLIndexToIndex(_m_firstAOHIforT.at(agentI).at(t));
   
    Index remainder = aohIwithinThisT;
    size_t vec_size = t; // the number of 'JAO' we are searching
        
    size_t nrO = GetNrObservations(agentI);
    size_t nrA = GetNrActions(agentI);
    size_t nrAO = nrO*nrA;
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrAO, (double)(stage));

        Index aoI_t2 = remainder / b;
        remainder -= aoI_t2 * b;

        aIs[t2] = IndexTools::
            ActionObservation_to_ActionIndex(aoI_t2, nrA, nrO);
        oIs[t2] = IndexTools::
            ActionObservation_to_ObservationIndex(aoI_t2, nrA, nrO);
    }

}